

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O2

void __thiscall Assimp::TriangulateProcess::Execute(TriangulateProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  byte bVar3;
  uint a;
  ulong uVar4;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"TriangulateProcess begin");
  bVar3 = 0;
  for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
    if (pScene->mMeshes[uVar4] != (aiMesh *)0x0) {
      bVar1 = TriangulateMesh((TriangulateProcess *)pLVar2,pScene->mMeshes[uVar4]);
      bVar3 = bVar3 | bVar1;
    }
  }
  pLVar2 = DefaultLogger::get();
  if (bVar3 != 0) {
    Logger::info(pLVar2,"TriangulateProcess finished. All polygons have been triangulated.");
    return;
  }
  Logger::debug(pLVar2,"TriangulateProcess finished. There was nothing to be done.");
  return;
}

Assistant:

void TriangulateProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TriangulateProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if (pScene->mMeshes[ a ]) {
            if ( TriangulateMesh( pScene->mMeshes[ a ] ) ) {
                bHas = true;
            }
        }
    }
    if ( bHas ) {
        ASSIMP_LOG_INFO( "TriangulateProcess finished. All polygons have been triangulated." );
    } else {
        ASSIMP_LOG_DEBUG( "TriangulateProcess finished. There was nothing to be done." );
    }
}